

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O0

EC_GROUP * anon_unknown.dwarf_263068::GetCurve(FileTest *t,char *key)

{
  bool bVar1;
  undefined8 uVar2;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string curve_name;
  char *key_local;
  FileTest *t_local;
  
  curve_name.field_2._8_8_ = key;
  std::__cxx11::string::string((string *)local_40);
  uVar2 = curve_name.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,(char *)uVar2,&local_61);
  bVar1 = FileTest::GetAttribute(t,(string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"P-224");
    if (bVar1) {
      t_local = (FileTest *)EC_group_p224();
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"P-256");
      if (bVar1) {
        t_local = (FileTest *)EC_group_p256();
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"P-384");
        if (bVar1) {
          t_local = (FileTest *)EC_group_p384();
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"P-521");
          if (bVar1) {
            t_local = (FileTest *)EC_group_p521();
          }
          else {
            uVar2 = std::__cxx11::string::c_str();
            FileTest::PrintLine(t,"Unknown curve \'%s\'",uVar2);
            t_local = (FileTest *)0x0;
          }
        }
      }
    }
  }
  else {
    t_local = (FileTest *)0x0;
  }
  std::__cxx11::string::~string((string *)local_40);
  return (EC_GROUP *)t_local;
}

Assistant:

static const EC_GROUP *GetCurve(FileTest *t, const char *key) {
  std::string curve_name;
  if (!t->GetAttribute(&curve_name, key)) {
    return nullptr;
  }

  if (curve_name == "P-224") {
    return EC_group_p224();
  }
  if (curve_name == "P-256") {
    return EC_group_p256();
  }
  if (curve_name == "P-384") {
    return EC_group_p384();
  }
  if (curve_name == "P-521") {
    return EC_group_p521();
  }

  t->PrintLine("Unknown curve '%s'", curve_name.c_str());
  return nullptr;
}